

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O0

void mallocFail(Int32 n)

{
  Int32 n_local;
  
  fprintf(_stderr,"%s: malloc failed on request for %d bytes.\n",progName,(ulong)(uint)n);
  fprintf(_stderr,"%s: warning: output file(s) may be incomplete.\n",progName);
  exit(1);
}

Assistant:

static void mallocFail ( Int32 n )
{
   fprintf ( stderr,
             "%s: malloc failed on request for %d bytes.\n",
            progName, n );
   fprintf ( stderr, "%s: warning: output file(s) may be incomplete.\n",
             progName );
   exit ( 1 );
}